

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5_pnnx.cpp
# Opt level: O3

void qsort_descent_inplace(vector<Object,_std::allocator<Object>_> *faceobjects,int left,int right)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int *piVar7;
  int iVar8;
  pointer pOVar9;
  pointer pOVar10;
  pointer pOVar11;
  int right_00;
  int iVar12;
  long lVar13;
  long lVar14;
  int *piVar15;
  
  pOVar9 = (faceobjects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
           super__Vector_impl_data._M_start;
  do {
    right_00 = right;
    iVar12 = left;
    if (left <= right) {
      fVar1 = pOVar9[(left + right) / 2].prob;
      do {
        lVar13 = (long)iVar12 + -1;
        pOVar11 = pOVar9 + (long)iVar12 + -1;
        iVar8 = iVar12;
        do {
          iVar12 = iVar8;
          pOVar10 = pOVar11;
          lVar13 = lVar13 + 1;
          pOVar11 = pOVar10 + 1;
          iVar8 = iVar12 + 1;
        } while (fVar1 < pOVar10[1].prob);
        lVar14 = (long)right_00 + 1;
        piVar7 = &pOVar9[(long)right_00 + 1].label;
        iVar8 = right_00;
        do {
          right_00 = iVar8;
          piVar15 = piVar7;
          lVar14 = lVar14 + -1;
          piVar7 = piVar15 + -6;
          iVar8 = right_00 + -1;
        } while ((float)piVar15[-5] <= fVar1 && fVar1 != (float)piVar15[-5]);
        if (lVar13 <= lVar14) {
          uVar2 = *(undefined8 *)&pOVar10[1].label;
          *(undefined8 *)&pOVar10[1].label = *(undefined8 *)piVar7;
          uVar3 = *(undefined8 *)&pOVar11->rect;
          uVar4 = *(undefined8 *)&pOVar10[1].rect.width;
          uVar5 = *(undefined8 *)(piVar15 + -10);
          uVar6 = *(undefined8 *)(piVar15 + -8);
          (pOVar11->rect).x = (float)(int)uVar5;
          (pOVar11->rect).y = (float)(int)((ulong)uVar5 >> 0x20);
          pOVar10[1].rect.width = (float)(int)uVar6;
          pOVar10[1].rect.height = (float)(int)((ulong)uVar6 >> 0x20);
          *(undefined8 *)(piVar15 + -10) = uVar3;
          *(undefined8 *)(piVar15 + -8) = uVar4;
          *(undefined8 *)piVar7 = uVar2;
          pOVar9 = (faceobjects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          right_00 = right_00 + -1;
          iVar12 = iVar12 + 1;
        }
      } while (iVar12 <= right_00);
    }
    if (left < right_00) {
      qsort_descent_inplace(faceobjects,left,right_00);
      pOVar9 = (faceobjects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    left = iVar12;
  } while (iVar12 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<Object>& faceobjects, int left, int right)
{
    int i = left;
    int j = right;
    float p = faceobjects[(left + right) / 2].prob;

    while (i <= j)
    {
        while (faceobjects[i].prob > p)
            i++;

        while (faceobjects[j].prob < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(faceobjects[i], faceobjects[j]);

            i++;
            j--;
        }
    }

    #pragma omp parallel sections
    {
        #pragma omp section
        {
            if (left < j) qsort_descent_inplace(faceobjects, left, j);
        }
        #pragma omp section
        {
            if (i < right) qsort_descent_inplace(faceobjects, i, right);
        }
    }
}